

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GetValueFromIndirOpnd
          (Lowerer *this,IndirOpnd *indirOpnd,Opnd **pValueOpnd,IntConstType *pValue)

{
  bool bVar1;
  int32 iVar2;
  RegOpnd *pRVar3;
  long local_48;
  IntConstType value;
  Opnd *valueOpnd;
  RegOpnd *indexOpnd;
  IntConstType *pValue_local;
  Opnd **pValueOpnd_local;
  IndirOpnd *indirOpnd_local;
  Lowerer *this_local;
  
  pRVar3 = IR::IndirOpnd::GetIndexOpnd(indirOpnd);
  value = 0;
  local_48 = 0;
  if (pRVar3 == (RegOpnd *)0x0) {
    iVar2 = IR::IndirOpnd::GetOffset(indirOpnd);
    local_48 = (long)iVar2;
    if (local_48 < 0) {
      return false;
    }
    value = (IntConstType)IR::IntConstOpnd::New(local_48,TyInt32,this->m_func,false);
  }
  else {
    bVar1 = StackSym::IsIntConst(pRVar3->m_sym);
    if (bVar1) {
      pRVar3 = IR::Opnd::AsRegOpnd(&pRVar3->super_Opnd);
      iVar2 = StackSym::GetIntConstValue(pRVar3->m_sym);
      local_48 = (long)iVar2;
      if (local_48 < 0) {
        return false;
      }
      value = (IntConstType)IR::IntConstOpnd::New(local_48,TyInt32,this->m_func,false);
    }
  }
  *pValueOpnd = (Opnd *)value;
  *pValue = local_48;
  return true;
}

Assistant:

bool
Lowerer::GetValueFromIndirOpnd(IR::IndirOpnd *indirOpnd, IR::Opnd **pValueOpnd, IntConstType *pValue)
{
    IR::RegOpnd *indexOpnd = indirOpnd->GetIndexOpnd();
    IR::Opnd* valueOpnd = nullptr;
    IntConstType value = 0;
    if (!indexOpnd)
    {
        value = (IntConstType)indirOpnd->GetOffset();
        if (value < 0)
        {
            // Can't do fast path for negative index
            return false;
        }
        valueOpnd = IR::IntConstOpnd::New(value, TyInt32, this->m_func);
    }
    else if (indexOpnd->m_sym->IsIntConst())
    {
        value = indexOpnd->AsRegOpnd()->m_sym->GetIntConstValue();
        if (value < 0)
        {
            // Can't do fast path for negative index
            return false;
        }
        valueOpnd = IR::IntConstOpnd::New(value, TyInt32, this->m_func);
    }
    *pValueOpnd = valueOpnd;
    *pValue = value;
    return true;
}